

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O0

FloatImage * __thiscall nv::FloatImage::fastDownSample(FloatImage *this)

{
  ushort uVar1;
  ushort uVar2;
  float fVar3;
  FloatImage *pFVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  float local_13c;
  float f_2;
  uint x_5;
  float v2_1;
  float v1_1;
  float v0_1;
  uint y_3;
  float *dst_5;
  float *src_5;
  uint c_5;
  float scale_3;
  float f_1;
  float w2_2;
  float w1_2;
  float w0_2;
  uint x_4;
  uint y_2;
  float *dst_4;
  float *src_4;
  uint c_4;
  float scale_2;
  float f;
  float w2_1;
  float w1_1;
  float w0_1;
  uint x_3;
  float v2;
  float v1;
  float v0;
  uint y_1;
  float *dst_3;
  float *src_3;
  uint c_3;
  float scale_1;
  uint x_2;
  uint y;
  float *dst_2;
  float *src_2;
  uint c_2;
  uint x_1;
  float *dst_1;
  float *src_1;
  uint c_1;
  float w2;
  float w1;
  float w0;
  uint x;
  float *dst;
  float *src;
  uint c;
  float scale;
  uint n;
  float local_34;
  uint local_30;
  uint h;
  float local_28;
  uint w;
  AutoPtr<nv::FloatImage> local_18;
  AutoPtr<nv::FloatImage> dst_image;
  FloatImage *this_local;
  
  dst_image.m_ptr = this;
  pFVar4 = (FloatImage *)operator_new(0x20);
  FloatImage(pFVar4);
  AutoPtr<nv::FloatImage>::AutoPtr(&local_18,pFVar4);
  h = 1;
  local_30 = (uint)(this->m_width >> 1);
  pfVar5 = (float *)max<int>((int *)&h,(int *)&local_30);
  local_28 = *pfVar5;
  n = 1;
  scale = (float)(uint)(this->m_height >> 1);
  pfVar5 = (float *)max<int>((int *)&n,(int *)&scale);
  local_34 = *pfVar5;
  pFVar4 = AutoPtr<nv::FloatImage>::operator->(&local_18);
  allocate(pFVar4,this->m_componentNum,(uint)local_28,(uint)local_34);
  if ((this->m_width == 1) || (this->m_height == 1)) {
    fVar3 = (float)((int)local_28 * (int)local_34);
    if ((this->m_width * this->m_height & 1) == 0) {
      for (src_1._4_4_ = 0; src_1._4_4_ < this->m_componentNum; src_1._4_4_ = src_1._4_4_ + 1) {
        dst_1 = channel(this,src_1._4_4_);
        pFVar4 = AutoPtr<nv::FloatImage>::operator->(&local_18);
        _c_2 = channel(pFVar4,src_1._4_4_);
        for (src_2._4_4_ = 0.0; (uint)src_2._4_4_ < (uint)fVar3;
            src_2._4_4_ = (float)((int)src_2._4_4_ + 1)) {
          *_c_2 = (*dst_1 + dst_1[1]) * 0.5;
          _c_2 = _c_2 + 1;
          dst_1 = dst_1 + 2;
        }
      }
    }
    else {
      for (src._0_4_ = 0; (uint)src < this->m_componentNum; src._0_4_ = (uint)src + 1) {
        dst = channel(this,(uint)src);
        pFVar4 = AutoPtr<nv::FloatImage>::operator->(&local_18);
        _w0 = channel(pFVar4,(uint)src);
        for (w1 = 0.0; (uint)w1 < (uint)fVar3; w1 = (float)((int)w1 + 1)) {
          *_w0 = (1.0 / (float)((int)fVar3 * 2 + 1)) *
                 ((float)((int)w1 + 1) * dst[2] +
                 (float)(uint)((int)fVar3 - (int)w1) * *dst + (float)(uint)fVar3 * dst[1]);
          dst = dst + 2;
          _w0 = _w0 + 1;
        }
      }
    }
  }
  else if (((this->m_width & 1) == 0) && ((this->m_height & 1) == 0)) {
    for (src_2._0_4_ = 0; (uint)src_2 < this->m_componentNum; src_2._0_4_ = (uint)src_2 + 1) {
      dst_2 = channel(this,(uint)src_2);
      pFVar4 = AutoPtr<nv::FloatImage>::operator->(&local_18);
      _x_2 = channel(pFVar4,(uint)src_2);
      for (scale_1 = 0.0; (uint)scale_1 < (uint)local_34; scale_1 = (float)((int)scale_1 + 1)) {
        for (c_3 = 0; c_3 < (uint)local_28; c_3 = c_3 + 1) {
          *_x_2 = (*dst_2 + dst_2[1] + dst_2[this->m_width] + dst_2[(int)(this->m_width + 1)]) *
                  0.25;
          _x_2 = _x_2 + 1;
          dst_2 = dst_2 + 2;
        }
        dst_2 = dst_2 + (int)(uint)this->m_width;
      }
    }
  }
  else if (((this->m_width & 1) == 0) || ((this->m_height & 1) == 0)) {
    if ((this->m_width & 1) == 0) {
      if ((this->m_height & 1) != 0) {
        uVar1 = this->m_height;
        for (src_5._0_4_ = 0; (uint)src_5 < this->m_componentNum; src_5._0_4_ = (uint)src_5 + 1) {
          dst_5 = channel(this,(uint)src_5);
          pFVar4 = AutoPtr<nv::FloatImage>::operator->(&local_18);
          _v0_1 = channel(pFVar4,(uint)src_5);
          for (v1_1 = 0.0; (uint)v1_1 < (uint)local_34; v1_1 = (float)((int)v1_1 + 1)) {
            for (local_13c = 0.0; (uint)local_13c < (uint)local_28;
                local_13c = (float)((int)local_13c + 1)) {
              *_v0_1 = ((float)((int)v1_1 + 1) *
                        (dst_5[(uint)this->m_width * 2 + (int)local_13c * 2] +
                        dst_5[(uint)this->m_width * 2 + (int)local_13c * 2 + 1]) +
                       (float)(uint)local_34 *
                       (dst_5[(uint)this->m_width + (int)local_13c * 2] +
                       dst_5[(uint)this->m_width + (int)local_13c * 2 + 1]) +
                       (float)(uint)((int)local_34 - (int)v1_1) *
                       (dst_5[(uint)((int)local_13c * 2)] + dst_5[(int)local_13c * 2 + 1]) + 0.0) *
                       (1.0 / (float)((uint)uVar1 << 1));
              _v0_1 = _v0_1 + 1;
            }
            dst_5 = dst_5 + (int)((uint)this->m_width << 1);
          }
        }
      }
    }
    else {
      uVar1 = this->m_width;
      for (src_4._4_4_ = 0; src_4._4_4_ < this->m_componentNum; src_4._4_4_ = src_4._4_4_ + 1) {
        dst_4 = channel(this,src_4._4_4_);
        pFVar4 = AutoPtr<nv::FloatImage>::operator->(&local_18);
        _x_4 = channel(pFVar4,src_4._4_4_);
        for (w0_2 = 0.0; (uint)w0_2 < (uint)local_34; w0_2 = (float)((int)w0_2 + 1)) {
          for (w1_2 = 0.0; (uint)w1_2 < (uint)local_28; w1_2 = (float)((int)w1_2 + 1)) {
            *_x_4 = ((float)((int)w1_2 + 1) *
                     (dst_4[(int)w1_2 * 2 + 2] + dst_4[(uint)this->m_width + (int)w1_2 * 2 + 2]) +
                    (float)(uint)local_28 *
                    (dst_4[(int)w1_2 * 2 + 1] + dst_4[(uint)this->m_width + (int)w1_2 * 2 + 1]) +
                    (float)(uint)((int)local_28 - (int)w1_2) *
                    (dst_4[(uint)((int)w1_2 << 1)] + dst_4[(uint)this->m_width + (int)w1_2 * 2]) +
                    0.0) * (1.0 / (float)((uint)uVar1 << 1));
            _x_4 = _x_4 + 1;
          }
          dst_4 = dst_4 + (int)((uint)this->m_width << 1);
        }
      }
    }
  }
  else {
    uVar1 = this->m_width;
    uVar2 = this->m_height;
    for (src_3._0_4_ = 0; (uint)src_3 < this->m_componentNum; src_3._0_4_ = (uint)src_3 + 1) {
      dst_3 = channel(this,(uint)src_3);
      pFVar4 = AutoPtr<nv::FloatImage>::operator->(&local_18);
      _v0 = channel(pFVar4,(uint)src_3);
      for (v1 = 0.0; (uint)v1 < (uint)local_34; v1 = (float)((int)v1 + 1)) {
        for (w1_1 = 0.0; (uint)w1_1 < (uint)local_28; w1_1 = (float)((int)w1_1 + 1)) {
          fVar3 = (float)(uint)((int)local_28 - (int)w1_1);
          fVar6 = (float)(uint)local_28;
          fVar7 = (float)((int)w1_1 + 1);
          *_v0 = ((float)((int)v1 + 1) *
                  (fVar7 * dst_3[(int)w1_1 * 2 + 2] +
                  fVar3 * dst_3[(uint)this->m_width * 2 + (int)w1_1 * 2] +
                  fVar6 * dst_3[(uint)this->m_width * 2 + (int)w1_1 * 2 + 1]) +
                 (float)(uint)local_34 *
                 (fVar7 * dst_3[(int)w1_1 * 2 + 2] +
                 fVar3 * dst_3[(uint)this->m_width + (int)w1_1 * 2] +
                 fVar6 * dst_3[(uint)this->m_width + (int)w1_1 * 2 + 1]) +
                 (float)(uint)((int)local_34 - (int)v1) *
                 (fVar7 * dst_3[(int)w1_1 * 2 + 2] +
                 fVar3 * dst_3[(uint)((int)w1_1 * 2)] + fVar6 * dst_3[(int)w1_1 * 2 + 1]) + 0.0) *
                 (1.0 / (float)(int)((uint)uVar1 * (uint)uVar2));
          _v0 = _v0 + 1;
        }
        dst_3 = dst_3 + (int)((uint)this->m_width << 1);
      }
    }
  }
  pFVar4 = AutoPtr<nv::FloatImage>::release(&local_18);
  AutoPtr<nv::FloatImage>::~AutoPtr(&local_18);
  return pFVar4;
}

Assistant:

FloatImage * FloatImage::fastDownSample() const
{
	nvDebugCheck(m_width != 1 || m_height != 1);
	
	AutoPtr<FloatImage> dst_image( new FloatImage() );

	const uint w = max(1, m_width / 2);
	const uint h = max(1, m_height / 2);
	dst_image->allocate(m_componentNum, w, h);

	// 1D box filter.
	if (m_width == 1 || m_height == 1)
	{
		const uint n = w * h;
		
		if ((m_width * m_height) & 1)
		{
			const float scale = 1.0f / (2 * n + 1);
			
			for(uint c = 0; c < m_componentNum; c++)
			{
				const float * src = this->channel(c);
				float * dst = dst_image->channel(c);
				
				for(uint x = 0; x < n; x++)
				{
					const float w0 = float(n - x);
					const float w1 = float(n - 0);
					const float w2 = float(1 + x);
					
					*dst++ = scale * (w0 * src[0] + w1 * src[1] + w2 * src[2]);
					src += 2;
				}
			}
		}
		else
		{
			for(uint c = 0; c < m_componentNum; c++)
			{
				const float * src = this->channel(c);
				float * dst = dst_image->channel(c);
				
				for(uint x = 0; x < n; x++)
				{
					*dst = 0.5f * (src[0] + src[1]);
					dst++;
					src += 2;
				}
			}
		}
	}
	
	// Regular box filter.
	else if ((m_width & 1) == 0 && (m_height & 1) == 0)
	{
		for(uint c = 0; c < m_componentNum; c++)
		{
			const float * src = this->channel(c);
			float * dst = dst_image->channel(c);
			
			for(uint y = 0; y < h; y++)
			{
				for(uint x = 0; x < w; x++)
				{
					*dst = 0.25f * (src[0] + src[1] + src[m_width] + src[m_width + 1]);
					dst++;
					src += 2;
				}
				
				src += m_width;
			}
		}
	}
	
	// Polyphase filters.
	else if (m_width & 1 && m_height & 1)
	{
		nvDebugCheck(m_width == 2 * w + 1);
		nvDebugCheck(m_height == 2 * h + 1);
		
		const float scale = 1.0f / (m_width * m_height);
		
		for(uint c = 0; c < m_componentNum; c++)
		{
			const float * src = this->channel(c);
			float * dst = dst_image->channel(c);
			
			for(uint y = 0; y < h; y++)
			{
				const float v0 = float(h - y);
				const float v1 = float(h - 0);
				const float v2 = float(1 + y);
				
				for (uint x = 0; x < w; x++)
				{
					const float w0 = float(w - x);
					const float w1 = float(w - 0);
					const float w2 = float(1 + x);
					
					float f = 0.0f;
					f += v0 * (w0 * src[0 * m_width + 2 * x] + w1 * src[0 * m_width + 2 * x + 1] + w2 * src[0 * m_width + 2 * x + 2]);
					f += v1 * (w0 * src[1 * m_width + 2 * x] + w1 * src[1 * m_width + 2 * x + 1] + w2 * src[0 * m_width + 2 * x + 2]);
					f += v2 * (w0 * src[2 * m_width + 2 * x] + w1 * src[2 * m_width + 2 * x + 1] + w2 * src[0 * m_width + 2 * x + 2]);
					
					*dst = f * scale;
					dst++;
				}
				
				src += 2 * m_width;
			}
		}
	}
	else if (m_width & 1)
	{
		nvDebugCheck(m_width == 2 * w + 1);
		const float scale = 1.0f / (2 * m_width);
		
		for(uint c = 0; c < m_componentNum; c++)
		{
			const float * src = this->channel(c);
			float * dst = dst_image->channel(c);
			
			for(uint y = 0; y < h; y++)
			{
				for (uint x = 0; x < w; x++)
				{
					const float w0 = float(w - x);
					const float w1 = float(w - 0);
					const float w2 = float(1 + x);
					
					float f = 0.0f;
					f += w0 * (src[2 * x + 0] + src[m_width + 2 * x + 0]);
					f += w1 * (src[2 * x + 1] + src[m_width + 2 * x + 1]);
					f += w2 * (src[2 * x + 2] + src[m_width + 2 * x + 2]);
					
					*dst = f * scale;
					dst++;
				}
				
				src += 2 * m_width;
			}
		}
	}
	else if (m_height & 1)
	{
		nvDebugCheck(m_height == 2 * h + 1);
		
		const float scale = 1.0f / (2 * m_height);
		
		for(uint c = 0; c < m_componentNum; c++)
		{
			const float * src = this->channel(c);
			float * dst = dst_image->channel(c);
			
			for(uint y = 0; y < h; y++)
			{
				const float v0 = float(h - y);
				const float v1 = float(h - 0);
				const float v2 = float(1 + y);
				
				for (uint x = 0; x < w; x++)
				{
					float f = 0.0f;
					f += v0 * (src[0 * m_width + 2 * x] + src[0 * m_width + 2 * x + 1]);
					f += v1 * (src[1 * m_width + 2 * x] + src[1 * m_width + 2 * x + 1]);
					f += v2 * (src[2 * m_width + 2 * x] + src[2 * m_width + 2 * x + 1]);
					
					*dst = f * scale;
					dst++;
				}
				
				src += 2 * m_width;
			}
		}
	}
	
	return dst_image.release();
}